

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O0

int op_decode(OggOpusFile *_of,op_sample *_pcm,ogg_packet *_op,int _nsamples,int _nchannels)

{
  int local_34;
  int ret;
  int _nchannels_local;
  int _nsamples_local;
  ogg_packet *_op_local;
  op_sample *_pcm_local;
  OggOpusFile *_of_local;
  
  if (_of->decode_cb == (op_decode_cb_func)0x0) {
    local_34 = 0x1a40;
  }
  else {
    local_34 = (*_of->decode_cb)(_of->decode_cb_ctx,_of->od,_pcm,_op,_nsamples,_nchannels,0x1b80,
                                 _of->cur_link);
  }
  if (local_34 == 0x1a40) {
    local_34 = opus_multistream_decode_float
                         (_of->od,_op->packet,_op->bytes & 0xffffffff,_pcm,_nsamples,0);
  }
  else if (0 < local_34) {
    return -0x88;
  }
  if (local_34 < 0) {
    _of_local._4_4_ = -0x88;
  }
  else {
    _of_local._4_4_ = local_34;
  }
  return _of_local._4_4_;
}

Assistant:

static int op_decode(OggOpusFile *_of,op_sample *_pcm,
 const ogg_packet *_op,int _nsamples,int _nchannels){
  int ret;
  /*First we try using the application-provided decode callback.*/
  if(_of->decode_cb!=NULL){
#if defined(OP_FIXED_POINT)
    ret=(*_of->decode_cb)(_of->decode_cb_ctx,_of->od,_pcm,_op,
     _nsamples,_nchannels,OP_DEC_FORMAT_SHORT,_of->cur_link);
#else
    ret=(*_of->decode_cb)(_of->decode_cb_ctx,_of->od,_pcm,_op,
     _nsamples,_nchannels,OP_DEC_FORMAT_FLOAT,_of->cur_link);
#endif
  }
  else ret=OP_DEC_USE_DEFAULT;
  /*If the application didn't want to handle decoding, do it ourselves.*/
  if(ret==OP_DEC_USE_DEFAULT){
#if defined(OP_FIXED_POINT)
    ret=opus_multistream_decode(_of->od,
     _op->packet,_op->bytes,_pcm,_nsamples,0);
#else
    ret=opus_multistream_decode_float(_of->od,
     _op->packet,_op->bytes,_pcm,_nsamples,0);
#endif
    OP_ASSERT(ret<0||ret==_nsamples);
  }
  /*If the application returned a positive value other than 0 or
     OP_DEC_USE_DEFAULT, fail.*/
  else if(OP_UNLIKELY(ret>0))return OP_EBADPACKET;
  if(OP_UNLIKELY(ret<0))return OP_EBADPACKET;
  return ret;
}